

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

int p2sc_create_file(int nuke,char *name,void *buf,size_t nbyte)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  ssize_t sVar5;
  size_t in_RCX;
  void *in_RDX;
  char *in_RSI;
  int in_EDI;
  int e;
  int flags;
  int fd;
  int local_28;
  
  local_28 = 0x241;
  if (in_EDI == 0) {
    local_28 = 0x2c1;
  }
  iVar1 = open(in_RSI,local_28,0x1a4);
  if (iVar1 != -1) {
    sVar5 = write(iVar1,in_RDX,in_RCX);
    if (((sVar5 != -1) && (iVar2 = fsync(iVar1), iVar2 != -1)) &&
       (iVar1 = close(iVar1), iVar1 != -1)) {
      return 0;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    unlink(in_RSI);
    uVar4 = g_strerror(iVar1);
    _p2sc_msg("p2sc_create_file",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x15d,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,"%s: %s",in_RSI,
              uVar4);
    exit(1);
  }
  piVar3 = __errno_location();
  if (*piVar3 == 0x11) {
    return -1;
  }
  piVar3 = __errno_location();
  uVar4 = g_strerror(*piVar3);
  _p2sc_msg("p2sc_create_file",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,0x156,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,"open(%s): %s",
            in_RSI,uVar4);
  exit(1);
}

Assistant:

int p2sc_create_file(int nuke, const char *name, const void *buf, size_t nbyte) {
    int fd, flags = O_CREAT | O_TRUNC | O_WRONLY;

    if (!nuke)
        flags |= O_EXCL;

    fd = open(name, flags, S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
    if (fd == -1) {
        if (errno == EEXIST)
            return -1;
        else
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "open(%s): %s", name, g_strerror(errno));
    }

    if (write(fd, buf, nbyte) == -1 || fsync(fd) == -1 || close(fd) == -1) {
        int e = errno;

        unlink(name);
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: %s", name, g_strerror(e));
    }

    return 0;
}